

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_backtrace.cpp
# Opt level: O1

int foo(void)

{
  runtime_error *this;
  string local_40;
  
  this = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"My Error","");
  booster::runtime_error::runtime_error(this,&local_40);
  __cxa_throw(this,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

int foo()
{
	throw booster::runtime_error("My Error");
	return 10;
}